

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O3

void __thiscall
cmCTestSVN::InfoParser::InfoParser
          (InfoParser *this,cmCTestSVN *svn,char *prefix,string *rev,SVNInfo *svninfo)

{
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',true);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__InfoParser_0094a5f0;
  this->Rev = rev;
  this->SVNRepo = svninfo;
  (this->RegexRev).regmust = (char *)0x0;
  (this->RegexRev).program = (char *)0x0;
  (this->RegexRev).progsize = 0;
  memset(&this->RegexRev,0,0xaa);
  (this->RegexURL).regmust = (char *)0x0;
  (this->RegexURL).program = (char *)0x0;
  (this->RegexURL).progsize = 0;
  memset(&this->RegexURL,0,0xaa);
  (this->RegexRoot).regmust = (char *)0x0;
  (this->RegexRoot).program = (char *)0x0;
  (this->RegexRoot).progsize = 0;
  memset(&this->RegexRoot,0,0xaa);
  cmProcessTools::LineParser::SetLog
            (&this->super_LineParser,(svn->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexRev,"^Revision: ([0-9]+)");
  cmsys::RegularExpression::compile(&this->RegexURL,"^URL: +([^ ]+) *$");
  cmsys::RegularExpression::compile(&this->RegexRoot,"^Repository Root: +([^ ]+) *$");
  return;
}

Assistant:

InfoParser(cmCTestSVN* svn, const char* prefix, std::string& rev,
             SVNInfo& svninfo)
    : Rev(rev)
    , SVNRepo(svninfo)
  {
    this->SetLog(&svn->Log, prefix);
    this->RegexRev.compile("^Revision: ([0-9]+)");
    this->RegexURL.compile("^URL: +([^ ]+) *$");
    this->RegexRoot.compile("^Repository Root: +([^ ]+) *$");
  }